

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O0

void N_VDestroy_ManyVector(N_Vector v)

{
  long *in_RDI;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_18;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if ((*(int *)(*in_RDI + 0x18) == 1) && (*(long *)(*in_RDI + 0x10) != 0)) {
        for (local_18 = 0; local_18 < *(long *)*in_RDI; local_18 = local_18 + 1) {
          N_VDestroy(*(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8));
          *(undefined8 *)(*(long *)(*in_RDI + 0x10) + local_18 * 8) = 0;
        }
      }
      free(*(void **)(*in_RDI + 0x10));
      *(undefined8 *)(*in_RDI + 0x10) = 0;
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void MVAPPEND(N_VDestroy)(N_Vector v)
{
  SUNFunctionBegin(v->sunctx);

  sunindextype i;

  if (v == NULL) { return; }

  /* free content */
  if (v->content != NULL)
  {
    /* if subvectors are owned by v, then Destroy those */
    if ((MANYVECTOR_OWN_DATA(v) == SUNTRUE) && (MANYVECTOR_SUBVECS(v) != NULL))
    {
      for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
      {
        N_VDestroy(MANYVECTOR_SUBVEC(v, i));
        MANYVECTOR_SUBVEC(v, i) = NULL;
      }
    }

    /* free subvector array */
    free(MANYVECTOR_SUBVECS(v));
    MANYVECTOR_SUBVECS(v) = NULL;

#ifdef MANYVECTOR_BUILD_WITH_MPI
    /* free communicator */
    if (MANYVECTOR_COMM(v) != MPI_COMM_NULL)
    {
      SUNCheckMPICallVoid(MPI_Comm_free(&(MANYVECTOR_COMM(v))));
    }
    MANYVECTOR_COMM(v) = MPI_COMM_NULL;
#endif

    /* free content structure */
    free(v->content);
    v->content = NULL;
  }

  /* free ops and vector */
  if (v->ops != NULL)
  {
    free(v->ops);
    v->ops = NULL;
  }
  free(v);
  v = NULL;

  return;
}